

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O3

void __thiscall UKF::Prediction(UKF *this,double delta_t)

{
  VectorXd *this_00;
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  double **ppdVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  DenseIndex DVar8;
  uint uVar9;
  Index size_1;
  undefined8 *puVar10;
  Index index_6;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *pLVar11;
  MatrixXd *pMVar12;
  Matrix<double,_1,1,0,_1,1> *pMVar13;
  Matrix<double,_1,1,0,_1,1> *pMVar14;
  char *pcVar15;
  Index index_1;
  long lVar16;
  undefined8 in_RSI;
  Index index;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  Index index_3;
  ulong uVar20;
  double *pdVar21;
  Index index_5;
  long lVar22;
  Index row;
  long lVar23;
  Index row_1;
  int iVar24;
  bool bVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  VectorXd x_aug;
  MatrixXd Xsig_aug;
  MatrixXd P_aug;
  MatrixXd Xsig;
  MatrixXd L;
  MatrixXd A;
  VectorXd x_diff;
  long local_200;
  DenseStorage<double,__1,__1,_1,_0> local_1f8;
  undefined1 local_1e8 [24];
  MatrixXd *local_1d0;
  MatrixXd *pMStack_1c8;
  Matrix<double,_1,1,0,_1,1> *local_1c0;
  double local_1b8;
  DenseStorage<double,__1,__1,__1,_0> local_1a8;
  DenseStorage<double,__1,__1,__1,_0> local_188;
  DenseStorage<double,__1,__1,__1,_0> local_168;
  double local_148;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  void *local_118;
  ulong local_110;
  long local_108;
  void *local_100;
  ulong local_f8;
  long local_f0;
  double local_e8;
  undefined8 uStack_e0;
  void *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  undefined8 uStack_90;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *local_80;
  PlainObject *local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar20 = (ulong)this->n_x_;
  uVar17 = uVar20 * 2 + 1;
  local_168.m_data = (double *)0x0;
  local_168.m_rows = 0;
  local_168.m_cols = 0;
  if ((long)(uVar17 | uVar20) < 0) goto LAB_001056dd;
  local_148 = delta_t;
  if ((this->n_x_ != 0) &&
     (auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar5 / SEXT816((long)uVar17),0) < (long)uVar20)) {
    puVar10 = (undefined8 *)
              __cxa_allocate_exception(8,in_RSI,SUB168(auVar5 % SEXT816((long)uVar17),0));
    *puVar10 = operator_delete;
    __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_168,uVar17 * uVar20,uVar20,uVar17);
  local_140 = (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&this->P_;
  Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::LLT
            ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_1e8,(MatrixType *)local_140);
  if (local_1d0._0_1_ == false) {
LAB_001056fc:
    __assert_fail("m_isInitialized && \"LLT is not initialized.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Cholesky/LLT.h"
                  ,0x6a,
                  "typename Traits::MatrixL Eigen::LLT<Eigen::Matrix<double, -1, -1>>::matrixL() const [MatrixType = Eigen::Matrix<double, -1, -1>, UpLo = 1]"
                 );
  }
  local_188.m_data = (double *)local_1e8;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_100,
             (EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
              *)&local_188);
  free((void *)local_1e8._0_8_);
  this->lambda_ = (double)(3 - this->n_x_);
  if (local_168.m_rows < 0 && local_168.m_data != (double *)0x0) {
LAB_001055cc:
    __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/MapBase.h"
                  ,0x94,
                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                 );
  }
  if (local_168.m_cols < 1) {
LAB_001055eb:
    __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Block.h"
                  ,0x76,
                  "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                 );
  }
  if (local_168.m_rows ==
      (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    uVar17 = (ulong)((uint)((ulong)local_168.m_data >> 3) & 1);
    if (local_168.m_rows <= (long)uVar17) {
      uVar17 = local_168.m_rows;
    }
    if (((ulong)local_168.m_data & 7) != 0) {
      uVar17 = local_168.m_rows;
    }
    this_00 = &this->x_;
    lVar18 = local_168.m_rows - uVar17;
    if (0 < (long)uVar17) {
      pdVar21 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      uVar20 = 0;
      do {
        local_168.m_data[uVar20] = pdVar21[uVar20];
        uVar20 = uVar20 + 1;
      } while (uVar17 != uVar20);
    }
    uVar20 = (lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
    if (1 < lVar18) {
      do {
        pdVar21 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data + uVar17;
        dVar6 = pdVar21[1];
        local_168.m_data[uVar17] = *pdVar21;
        (local_168.m_data + uVar17)[1] = dVar6;
        uVar17 = uVar17 + 2;
      } while ((long)uVar17 < (long)uVar20);
    }
    if ((long)uVar20 < local_168.m_rows) {
      pdVar21 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      do {
        local_168.m_data[uVar20] = pdVar21[uVar20];
        uVar20 = uVar20 + 1;
      } while (local_168.m_rows != uVar20);
    }
    uVar17 = (ulong)(uint)this->n_x_;
    if (0 < this->n_x_) {
      local_200 = 8;
      iVar24 = 1;
      lVar16 = 0;
      lVar18 = 0;
      do {
        dVar6 = (double)(int)uVar17 + this->lambda_;
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        if (((long)local_f8 < 0) &&
           ((void *)((long)local_100 + local_f8 * lVar18 * 8) != (void *)0x0)) goto LAB_001055cc;
        if (local_f0 <= lVar18) goto LAB_001055eb;
        if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != local_f8) goto LAB_00105629;
        lVar1 = lVar18 + 1;
        pdVar21 = local_168.m_data + local_168.m_rows * lVar1;
        if (local_168.m_rows < 0 && pdVar21 != (double *)0x0) goto LAB_001055cc;
        if (local_168.m_cols <= lVar1) goto LAB_001055eb;
        if (local_168.m_rows != local_f8) goto LAB_00105671;
        uVar17 = (ulong)((uint)((ulong)pdVar21 >> 3) & 1);
        if ((long)local_f8 <= (long)uVar17) {
          uVar17 = local_f8;
        }
        if (((ulong)pdVar21 & 7) != 0) {
          uVar17 = local_f8;
        }
        if (0 < (long)uVar17) {
          pdVar21 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          uVar20 = 0;
          do {
            *(double *)((long)local_168.m_data + uVar20 * 8 + local_168.m_rows * local_200) =
                 *(double *)((long)local_100 + uVar20 * 8 + local_f8 * lVar16) * dVar6 +
                 pdVar21[uVar20];
            uVar20 = uVar20 + 1;
          } while (uVar17 != uVar20);
        }
        lVar22 = local_f8 - uVar17;
        uVar20 = (lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
        if (1 < lVar22) {
          do {
            pdVar21 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data + uVar17;
            dVar26 = pdVar21[1];
            pdVar2 = (double *)((long)local_100 + uVar17 * 8 + local_f8 * lVar16);
            dVar7 = pdVar2[1];
            pdVar3 = (double *)((long)local_168.m_data + uVar17 * 8 + local_168.m_rows * local_200);
            *pdVar3 = *pdVar2 * dVar6 + *pdVar21;
            pdVar3[1] = dVar7 * dVar6 + dVar26;
            uVar17 = uVar17 + 2;
          } while ((long)uVar17 < (long)uVar20);
        }
        if ((long)uVar20 < (long)local_f8) {
          pdVar21 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          do {
            *(double *)((long)local_168.m_data + uVar20 * 8 + local_168.m_rows * local_200) =
                 *(double *)((long)local_100 + uVar20 * 8 + local_f8 * lVar16) * dVar6 +
                 pdVar21[uVar20];
            uVar20 = uVar20 + 1;
          } while (local_f8 != uVar20);
        }
        dVar6 = (double)this->n_x_ + this->lambda_;
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        if (((long)local_f8 < 0) &&
           ((void *)((long)local_100 + local_f8 * lVar18 * 8) != (void *)0x0)) goto LAB_001055cc;
        if (local_f0 <= lVar18) goto LAB_001055eb;
        if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != local_f8) goto LAB_0010565a;
        lVar18 = (long)this->n_x_;
        lVar22 = (int)lVar1 + lVar18;
        pdVar21 = local_168.m_data + local_168.m_rows * lVar22;
        if ((local_168.m_rows < 0) && (pdVar21 != (double *)0x0)) goto LAB_001055cc;
        if (((int)lVar22 < 0) || (local_168.m_cols <= lVar22)) goto LAB_001055eb;
        if (local_168.m_rows != local_f8) goto LAB_00105643;
        lVar22 = (long)iVar24;
        uVar17 = (ulong)((uint)((ulong)pdVar21 >> 3) & 1);
        if ((long)local_f8 <= (long)uVar17) {
          uVar17 = local_f8;
        }
        if (((ulong)pdVar21 & 7) != 0) {
          uVar17 = local_f8;
        }
        if (0 < (long)uVar17) {
          pdVar21 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          uVar20 = 0;
          do {
            local_168.m_data[(lVar18 + lVar22) * local_168.m_rows + uVar20] =
                 pdVar21[uVar20] -
                 *(double *)((long)local_100 + uVar20 * 8 + local_f8 * lVar16) * dVar6;
            uVar20 = uVar20 + 1;
          } while (uVar17 != uVar20);
        }
        lVar23 = local_f8 - uVar17;
        uVar20 = (lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
        if (1 < lVar23) {
          do {
            pdVar21 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data + uVar17;
            dVar26 = pdVar21[1];
            pdVar2 = (double *)((long)local_100 + uVar17 * 8 + local_f8 * lVar16);
            dVar7 = pdVar2[1];
            local_168.m_data[(lVar18 + lVar22) * local_168.m_rows + uVar17] =
                 *pdVar21 - *pdVar2 * dVar6;
            (local_168.m_data + (lVar18 + lVar22) * local_168.m_rows + uVar17)[1] =
                 dVar26 - dVar7 * dVar6;
            uVar17 = uVar17 + 2;
          } while ((long)uVar17 < (long)uVar20);
        }
        if ((long)uVar20 < (long)local_f8) {
          pdVar21 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          do {
            local_168.m_data[local_168.m_rows * (lVar18 + lVar22) + uVar20] =
                 pdVar21[uVar20] -
                 *(double *)((long)local_100 + uVar20 * 8 + local_f8 * lVar16) * dVar6;
            uVar20 = uVar20 + 1;
          } while (local_f8 != uVar20);
        }
        uVar17 = (ulong)this->n_x_;
        local_200 = local_200 + 8;
        lVar16 = lVar16 + 8;
        iVar24 = iVar24 + 1;
        lVar18 = lVar1;
      } while (lVar1 < (long)uVar17);
    }
    iVar24 = this->n_aug_;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_1f8,(long)iVar24,(long)iVar24,1);
    if (iVar24 < 0) {
      __assert_fail("dim >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Matrix.h"
                    ,0xf0,
                    "Eigen::Matrix<double, -1, 1>::Matrix(Index) [_Scalar = double, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                   );
    }
    local_188.m_data = (double *)0x0;
    local_188.m_rows = 0;
    local_188.m_cols = 0;
    lVar18 = (long)this->n_aug_;
    if (lVar18 < 0) {
LAB_001056dd:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/PlainObjectBase.h"
                    ,0xf1,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_188,lVar18 * lVar18,lVar18,lVar18);
    uVar20 = (ulong)this->n_aug_;
    uVar17 = uVar20 * 2 + 1;
    local_1a8.m_data = (double *)0x0;
    local_1a8.m_rows = 0;
    local_1a8.m_cols = 0;
    if ((long)(uVar17 | uVar20) < 0) goto LAB_001056dd;
    if ((this->n_aug_ != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uVar17),0) <
        (long)uVar20)) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = operator_delete;
      __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1a8,uVar17 * uVar20,uVar20,uVar17);
    this->lambda_ = (double)(3 - this->n_aug_);
    if (local_1f8.m_rows < 5) {
      pcVar15 = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
LAB_001057cb:
      __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Block.h"
                    ,0x8d,pcVar15);
    }
    if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != 5) {
      pcVar15 = 
      "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_001056b4;
    }
    uVar20 = (ulong)((uint)((ulong)local_1f8.m_data >> 3) & 1);
    uVar17 = 5;
    if (((ulong)local_1f8.m_data & 7) == 0) {
      uVar17 = uVar20;
    }
    if (uVar17 != 0) {
      pdVar21 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      uVar19 = 0;
      do {
        local_1f8.m_data[uVar19] = pdVar21[uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar17 != uVar19);
    }
    uVar17 = uVar17 | 4;
    if (((ulong)local_1f8.m_data & 7) == 0) {
      do {
        pdVar21 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data + uVar20;
        dVar6 = pdVar21[1];
        local_1f8.m_data[uVar20] = *pdVar21;
        (local_1f8.m_data + uVar20)[1] = dVar6;
        uVar20 = uVar20 + 2;
      } while (uVar20 < uVar17);
    }
    if ((uint)uVar17 < 5) {
      pdVar21 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      do {
        local_1f8.m_data[uVar17] = pdVar21[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar17 != 5);
    }
    if ((local_1f8.m_rows < 6) || (local_1f8.m_data[5] = 0.0, local_1f8.m_rows == 6)) {
LAB_0010560a:
      __assert_fail("index >= 0 && index < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                    ,0x18a,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    local_1f8.m_data[6] = 0.0;
    local_1e8._0_8_ = local_188.m_rows;
    local_1e8._8_8_ = local_188.m_cols;
    local_1e8._16_8_ = (Matrix<double,_1,1,0,_1,1> *)0x0;
    if (-1 < (local_188.m_cols | local_188.m_rows)) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_188,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)local_1e8);
      if ((local_188.m_rows < 5) || (local_188.m_cols < 5)) {
        pcVar15 = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
        ;
        goto LAB_001057cb;
      }
      if (((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows != 5) ||
         ((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols != 5)) {
        pcVar15 = 
        "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, OtherDerived = Eigen::Matrix<double, -1, -1>]"
        ;
        goto LAB_001056b4;
      }
      uVar17 = 5;
      if (((ulong)local_188.m_data & 7) == 0) {
        uVar17 = (ulong)((uint)((ulong)local_188.m_data >> 3) & 1);
      }
      lVar18 = 0;
      lVar16 = 0;
      pLVar11 = (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_188.m_data;
      do {
        if (uVar17 != 0) {
          lVar1 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
          pdVar21 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data;
          uVar20 = 0;
          do {
            (&(pLVar11->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data)[uVar20] = *(double **)((long)pdVar21 + uVar20 * 8 + lVar1 * lVar18);
            uVar20 = uVar20 + 1;
          } while (uVar17 != uVar20);
        }
        uVar19 = (ulong)(5U - (int)uVar17 & 6);
        uVar20 = uVar17;
        if (uVar19 != 0) {
          do {
            puVar10 = (undefined8 *)
                      ((long)(this->P_).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data +
                      uVar20 * 8 +
                      (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows * lVar18);
            DVar8 = puVar10[1];
            ppdVar4 = &(pLVar11->m_matrix).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_data + uVar20;
            *ppdVar4 = (double *)*puVar10;
            ppdVar4[1] = (double *)DVar8;
            uVar20 = uVar20 + 2;
          } while ((long)uVar20 < (long)(uVar19 + uVar17));
        }
        if (uVar19 + uVar17 < 5) {
          lVar22 = uVar19 + uVar17 + -1;
          lVar1 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
          pdVar21 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data;
          do {
            (&(pLVar11->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows)[lVar22] =
                 *(DenseIndex *)((long)pdVar21 + lVar22 * 8 + lVar1 * lVar18 + 8);
            lVar22 = lVar22 + 1;
          } while (lVar22 < 4);
        }
        uVar17 = (ulong)((int)uVar17 + (int)local_188.m_rows & 1);
        lVar16 = lVar16 + 1;
        pLVar11 = (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                  (&(pLVar11->m_matrix).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_data + local_188.m_rows);
        lVar18 = lVar18 + 8;
      } while (lVar16 != 5);
      if ((((local_188.m_rows < 6) || (local_188.m_cols < 6)) ||
          (*(double *)((long)local_188.m_data + local_188.m_rows * 0x28 + 0x28) =
                this->std_a_ * this->std_a_,
          (Matrix<double,_1,1,0,_1,1> *)local_188.m_rows == (Matrix<double,_1,1,0,_1,1> *)0x6)) ||
         ((MatrixXd *)local_188.m_cols == (MatrixXd *)0x6)) {
LAB_001055ad:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x151,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      *(double *)((long)local_188.m_data + local_188.m_rows * 0x30 + 0x30) =
           this->std_yawdd_ * this->std_yawdd_;
      Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::LLT
                ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_1e8,
                 (MatrixType *)&local_188);
      if (local_1d0._0_1_ == false) goto LAB_001056fc;
      local_80 = (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_1e8;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_118,
                 (EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                  *)&local_80);
      free((void *)local_1e8._0_8_);
      if (local_1a8.m_rows < 0 && local_1a8.m_data != (double *)0x0) goto LAB_001055cc;
      if (local_1a8.m_cols < 1) goto LAB_001055eb;
      if (local_1a8.m_rows != local_1f8.m_rows) goto LAB_0010571b;
      uVar17 = (ulong)((uint)((ulong)local_1a8.m_data >> 3) & 1);
      if (local_1a8.m_rows <= (long)uVar17) {
        uVar17 = local_1a8.m_rows;
      }
      if (((ulong)local_1a8.m_data & 7) != 0) {
        uVar17 = local_1a8.m_rows;
      }
      lVar18 = local_1a8.m_rows - uVar17;
      if (0 < (long)uVar17) {
        uVar20 = 0;
        do {
          local_1a8.m_data[uVar20] = local_1f8.m_data[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar17 != uVar20);
      }
      uVar20 = (lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
      if (1 < lVar18) {
        do {
          dVar6 = (local_1f8.m_data + uVar17)[1];
          local_1a8.m_data[uVar17] = local_1f8.m_data[uVar17];
          (local_1a8.m_data + uVar17)[1] = dVar6;
          uVar17 = uVar17 + 2;
        } while ((long)uVar17 < (long)uVar20);
      }
      if ((long)uVar20 < local_1a8.m_rows) {
        do {
          local_1a8.m_data[uVar20] = local_1f8.m_data[uVar20];
          uVar20 = uVar20 + 1;
        } while (local_1a8.m_rows != uVar20);
      }
      uVar9 = this->n_aug_;
      uVar17 = (ulong)uVar9;
      if (0 < (int)uVar9) {
        local_200 = 8;
        iVar24 = 1;
        lVar16 = 0;
        lVar18 = 0;
        do {
          dVar6 = (double)(int)uVar17 + this->lambda_;
          if (dVar6 < 0.0) {
            dVar6 = sqrt(dVar6);
          }
          else {
            dVar6 = SQRT(dVar6);
          }
          if (((long)local_110 < 0) &&
             ((void *)((long)local_118 + local_110 * lVar18 * 8) != (void *)0x0)) goto LAB_001055cc;
          if (local_108 <= lVar18) goto LAB_001055eb;
          if (local_1f8.m_rows != local_110) goto LAB_00105629;
          lVar1 = lVar18 + 1;
          pdVar21 = local_1a8.m_data + local_1a8.m_rows * lVar1;
          if (local_1a8.m_rows < 0 && pdVar21 != (double *)0x0) goto LAB_001055cc;
          if (local_1a8.m_cols <= lVar1) goto LAB_001055eb;
          if (local_1a8.m_rows != local_110) goto LAB_00105671;
          uVar17 = (ulong)((uint)((ulong)pdVar21 >> 3) & 1);
          if ((long)local_110 <= (long)uVar17) {
            uVar17 = local_110;
          }
          if (((ulong)pdVar21 & 7) != 0) {
            uVar17 = local_110;
          }
          if (0 < (long)uVar17) {
            uVar20 = 0;
            do {
              *(double *)((long)local_1a8.m_data + uVar20 * 8 + local_1a8.m_rows * local_200) =
                   *(double *)((long)local_118 + uVar20 * 8 + local_110 * lVar16) * dVar6 +
                   local_1f8.m_data[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar17 != uVar20);
          }
          lVar22 = local_110 - uVar17;
          uVar20 = (lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
          if (1 < lVar22) {
            do {
              dVar26 = (local_1f8.m_data + uVar17)[1];
              pdVar21 = (double *)((long)local_118 + uVar17 * 8 + local_110 * lVar16);
              dVar7 = pdVar21[1];
              pdVar2 = (double *)
                       ((long)local_1a8.m_data + uVar17 * 8 + local_1a8.m_rows * local_200);
              *pdVar2 = *pdVar21 * dVar6 + local_1f8.m_data[uVar17];
              pdVar2[1] = dVar7 * dVar6 + dVar26;
              uVar17 = uVar17 + 2;
            } while ((long)uVar17 < (long)uVar20);
          }
          if ((long)uVar20 < (long)local_110) {
            do {
              *(double *)((long)local_1a8.m_data + uVar20 * 8 + local_1a8.m_rows * local_200) =
                   *(double *)((long)local_118 + uVar20 * 8 + local_110 * lVar16) * dVar6 +
                   local_1f8.m_data[uVar20];
              uVar20 = uVar20 + 1;
            } while (local_110 != uVar20);
          }
          dVar6 = (double)this->n_aug_ + this->lambda_;
          if (dVar6 < 0.0) {
            dVar6 = sqrt(dVar6);
          }
          else {
            dVar6 = SQRT(dVar6);
          }
          if (((long)local_110 < 0) &&
             ((void *)((long)local_118 + local_110 * lVar18 * 8) != (void *)0x0)) goto LAB_001055cc;
          if (local_108 <= lVar18) goto LAB_001055eb;
          if (local_1f8.m_rows != local_110) goto LAB_0010565a;
          lVar18 = (long)this->n_aug_;
          lVar22 = (int)lVar1 + lVar18;
          pdVar21 = local_1a8.m_data + local_1a8.m_rows * lVar22;
          if ((local_1a8.m_rows < 0) && (pdVar21 != (double *)0x0)) goto LAB_001055cc;
          if (((int)lVar22 < 0) || (local_1a8.m_cols <= lVar22)) goto LAB_001055eb;
          if (local_1a8.m_rows != local_110) goto LAB_00105643;
          lVar22 = (long)iVar24;
          uVar17 = (ulong)((uint)((ulong)pdVar21 >> 3) & 1);
          if ((long)local_110 <= (long)uVar17) {
            uVar17 = local_110;
          }
          if (((ulong)pdVar21 & 7) != 0) {
            uVar17 = local_110;
          }
          if (0 < (long)uVar17) {
            uVar20 = 0;
            do {
              local_1a8.m_data[(lVar18 + lVar22) * local_1a8.m_rows + uVar20] =
                   local_1f8.m_data[uVar20] -
                   *(double *)((long)local_118 + uVar20 * 8 + local_110 * lVar16) * dVar6;
              uVar20 = uVar20 + 1;
            } while (uVar17 != uVar20);
          }
          lVar23 = local_110 - uVar17;
          uVar20 = (lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
          if (1 < lVar23) {
            do {
              dVar26 = (local_1f8.m_data + uVar17)[1];
              pdVar21 = (double *)((long)local_118 + uVar17 * 8 + local_110 * lVar16);
              dVar7 = pdVar21[1];
              local_1a8.m_data[(lVar18 + lVar22) * local_1a8.m_rows + uVar17] =
                   local_1f8.m_data[uVar17] - *pdVar21 * dVar6;
              (local_1a8.m_data + (lVar18 + lVar22) * local_1a8.m_rows + uVar17)[1] =
                   dVar26 - dVar7 * dVar6;
              uVar17 = uVar17 + 2;
            } while ((long)uVar17 < (long)uVar20);
          }
          if ((long)uVar20 < (long)local_110) {
            do {
              local_1a8.m_data[local_1a8.m_rows * (lVar18 + lVar22) + uVar20] =
                   local_1f8.m_data[uVar20] -
                   *(double *)((long)local_118 + uVar20 * 8 + local_110 * lVar16) * dVar6;
              uVar20 = uVar20 + 1;
            } while (local_110 != uVar20);
          }
          uVar9 = this->n_aug_;
          uVar17 = (ulong)(int)uVar9;
          local_200 = local_200 + 8;
          lVar16 = lVar16 + 8;
          iVar24 = iVar24 + 1;
          lVar18 = lVar1;
        } while (lVar1 < (long)uVar17);
      }
      if ((int)uVar9 < 0) {
        uVar17 = (ulong)(uVar9 * 2);
      }
      else {
        lVar18 = -1;
        do {
          if ((((local_1a8.m_rows < 1) || (lVar18 = lVar18 + 1, local_1a8.m_cols <= lVar18)) ||
              ((ulong)local_1a8.m_rows < 2)) ||
             (((local_1a8.m_rows == 2 || ((ulong)local_1a8.m_rows < 4)) ||
              ((local_1a8.m_rows == 4 || (((ulong)local_1a8.m_rows < 6 || (local_1a8.m_rows == 6))))
              )))) goto LAB_001055ad;
          lVar16 = local_1a8.m_rows * lVar18;
          local_128._8_8_ = 0;
          local_128._0_8_ = local_1a8.m_data[lVar16];
          local_e8 = local_1a8.m_data[lVar16 + 1];
          uStack_e0 = 0;
          local_b0 = local_1a8.m_data[lVar16 + 2];
          dVar6 = local_1a8.m_data[lVar16 + 3];
          local_98 = local_1a8.m_data[lVar16 + 4];
          local_a0 = local_1a8.m_data[lVar16 + 5];
          local_a8 = local_1a8.m_data[lVar16 + 6];
          uStack_90 = 0;
          if (ABS(local_98) <= 0.001) {
            local_138._8_8_ = 0;
            local_138._0_8_ = local_b0 * local_148;
            dVar26 = cos(dVar6);
            local_c8._8_4_ = extraout_XMM0_Dc_02;
            local_c8._0_8_ = dVar26;
            local_c8._12_4_ = extraout_XMM0_Dd_02;
            dVar26 = sin(dVar6);
            dVar26 = local_e8 + dVar26 * (double)local_138._0_8_;
            local_128._8_4_ = SUB84(dVar26,0);
            local_128._0_8_ =
                 (double)local_128._0_8_ + (double)local_c8._0_8_ * (double)local_138._0_8_;
            local_128._12_4_ = (int)((ulong)dVar26 >> 0x20);
            local_138._8_4_ = (int)uStack_90;
            local_138._0_8_ = local_98 * local_148 + dVar6;
            local_138._12_4_ = (int)((ulong)uStack_90 >> 0x20);
          }
          else {
            local_c8._8_8_ = 0;
            local_c8._0_8_ = local_b0 / local_98;
            local_138._0_8_ = local_98 * local_148 + dVar6;
            local_138._8_8_ = 0;
            dVar26 = sin((double)local_138._0_8_);
            local_48._8_4_ = extraout_XMM0_Dc;
            local_48._0_8_ = dVar26;
            local_48._12_4_ = extraout_XMM0_Dd;
            dVar26 = sin(dVar6);
            local_58._8_4_ = extraout_XMM0_Dc_00;
            local_58._0_8_ = dVar26;
            local_58._12_4_ = extraout_XMM0_Dd_00;
            dVar26 = cos(dVar6);
            local_68._8_4_ = extraout_XMM0_Dc_01;
            local_68._0_8_ = dVar26;
            local_68._12_4_ = extraout_XMM0_Dd_01;
            dVar26 = cos((double)local_138._0_8_);
            dVar26 = local_e8 + (double)local_c8._0_8_ * ((double)local_68._0_8_ - dVar26);
            local_128._8_4_ = SUB84(dVar26,0);
            local_128._0_8_ =
                 (double)local_128._0_8_ +
                 (double)local_c8._0_8_ * ((double)local_48._0_8_ - (double)local_58._0_8_);
            local_128._12_4_ = (int)((ulong)dVar26 >> 0x20);
          }
          local_e8 = cos(dVar6);
          dVar6 = sin(dVar6);
          uVar17 = (this->Xsig_pred_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
          ;
          if (((long)uVar17 < 1) ||
             ((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols <= lVar18)) goto LAB_001055ad;
          dVar26 = local_a0 * 0.5 * local_148 * local_148;
          pdVar21 = (this->Xsig_pred_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_data;
          lVar16 = uVar17 * lVar18;
          pdVar21[lVar16] = local_e8 * dVar26 + (double)local_128._0_8_;
          if ((uVar17 < 2) ||
             ((pdVar21[lVar16 + 1] = dVar26 * dVar6 + (double)local_128._8_8_, uVar17 == 2 ||
              (pdVar21[lVar16 + 2] = local_a0 * local_148 + local_b0, uVar17 < 4))))
          goto LAB_001055ad;
          pdVar21[lVar16 + 3] = local_a8 * 0.5 * local_148 * local_148 + (double)local_138._0_8_;
          if (uVar17 == 4) goto LAB_001055ad;
          pdVar21[lVar16 + 4] = local_a8 * local_148 + local_98;
          uVar9 = this->n_aug_;
          uVar17 = (long)(int)uVar9 * 2;
        } while (SBORROW8(lVar18,uVar17) != lVar18 + (long)(int)uVar9 * -2 < 0);
      }
      lVar18 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
      if (lVar18 < 1) goto LAB_0010560a;
      pdVar21 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      *pdVar21 = this->lambda_ / (this->lambda_ + (double)(int)uVar9);
      if (0 < (int)uVar17) {
        uVar20 = 0;
        do {
          if (lVar18 - 1U == uVar20) goto LAB_0010560a;
          pdVar21[uVar20 + 1] = 0.5 / (this->lambda_ + (double)(int)uVar9);
          uVar20 = uVar20 + 1;
        } while ((uVar17 & 0xffffffff) != uVar20);
      }
      local_1e8._0_8_ =
           (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
      local_1e8._16_8_ = (Matrix<double,_1,1,0,_1,1> *)0x0;
      if ((long)local_1e8._0_8_ < 0) {
        pcVar15 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_001057ea;
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      resizeLike<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this_00,
                 (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_1e8);
      pMVar14 = (Matrix<double,_1,1,0,_1,1> *)
                (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
      if (pMVar14 != (Matrix<double,_1,1,0,_1,1> *)local_1e8._0_8_) {
        pcVar15 = 
        "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
        ;
        goto LAB_001056b4;
      }
      uVar17 = (long)pMVar14 - ((long)pMVar14 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)pMVar14) {
        lVar18 = 0;
        do {
          pdVar21 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data + lVar18;
          *(undefined4 *)pdVar21 = local_1e8._16_4_;
          *(undefined4 *)((long)pdVar21 + 4) = local_1e8._20_4_;
          *(undefined4 *)(pdVar21 + 1) = local_1e8._16_4_;
          *(undefined4 *)((long)pdVar21 + 0xc) = local_1e8._20_4_;
          lVar18 = lVar18 + 2;
        } while (lVar18 < (long)uVar17);
      }
      auVar28 = _DAT_00117070;
      auVar5 = _DAT_00117060;
      lVar18 = (long)pMVar14 % 2;
      if (lVar18 != 0 && (long)uVar17 <= (long)pMVar14) {
        pdVar21 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data;
        lVar16 = lVar18 + -1;
        auVar27._8_4_ = (int)lVar16;
        auVar27._0_8_ = lVar16;
        auVar27._12_4_ = (int)((ulong)lVar16 >> 0x20);
        uVar17 = 0;
        auVar27 = auVar27 ^ _DAT_00117070;
        do {
          auVar29._8_4_ = (int)uVar17;
          auVar29._0_8_ = uVar17;
          auVar29._12_4_ = (int)(uVar17 >> 0x20);
          auVar29 = (auVar29 | auVar5) ^ auVar28;
          if ((bool)(~(auVar29._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar29._0_4_ ||
                      auVar27._4_4_ < auVar29._4_4_) & 1)) {
            pdVar21[((long)pMVar14 / 2) * 2 + uVar17] = (double)local_1e8._16_8_;
          }
          if ((auVar29._12_4_ != auVar27._12_4_ || auVar29._8_4_ <= auVar27._8_4_) &&
              auVar29._12_4_ <= auVar27._12_4_) {
            pdVar21[((long)pMVar14 / 2) * 2 + uVar17 + 1] = (double)local_1e8._16_8_;
          }
          uVar17 = uVar17 + 2;
        } while ((lVar18 + 1U & 0xfffffffffffffffe) != uVar17);
      }
      if (-1 < this->n_aug_) {
        lVar18 = 0;
        do {
          if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows <= lVar18) goto LAB_0010560a;
          pMVar14 = (Matrix<double,_1,1,0,_1,1> *)
                    (this->Xsig_pred_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_rows;
          pMVar12 = (MatrixXd *)
                    ((this->Xsig_pred_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data + (long)pMVar14 * lVar18);
          if ((long)pMVar14 < 0 && pMVar12 != (MatrixXd *)0x0) goto LAB_001055cc;
          if ((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols <= lVar18) goto LAB_001055eb;
          local_1b8 = (this->weights_).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data[lVar18];
          local_1e8._0_8_ = this_00;
          local_1e8._8_8_ = pMVar12;
          local_1e8._16_8_ = pMVar14;
          pMStack_1c8 = &this->Xsig_pred_;
          local_1c0 = pMVar14;
          if ((Matrix<double,_1,1,0,_1,1> *)
              (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows != pMVar14) goto LAB_00105629;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          resizeLike<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this_00,
                     (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                      *)local_1e8);
          pMVar14 = (Matrix<double,_1,1,0,_1,1> *)
                    (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows;
          if (pMVar14 != (Matrix<double,_1,1,0,_1,1> *)local_1e8._16_8_) {
            pcVar15 = 
            "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
            ;
            goto LAB_001056b4;
          }
          pMVar13 = (Matrix<double,_1,1,0,_1,1> *)
                    ((long)pMVar14 - ((long)pMVar14 >> 0x3f) & 0xfffffffffffffffe);
          if (1 < (long)pMVar14) {
            lVar16 = 0;
            do {
              pdVar21 = (double *)(*(long *)local_1e8._0_8_ + lVar16 * 8);
              auVar5 = *(undefined1 (*) [16])
                        (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           local_1e8._8_8_)->m_storage).m_data + lVar16);
              auVar28._0_8_ = local_1b8 * auVar5._0_8_ + *pdVar21;
              auVar28._8_8_ = local_1b8 * auVar5._8_8_ + pdVar21[1];
              *(undefined1 (*) [16])
               ((this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data + lVar16) = auVar28;
              lVar16 = lVar16 + 2;
            } while (lVar16 < (long)pMVar13);
          }
          if ((long)pMVar13 < (long)pMVar14) {
            lVar16 = *(long *)local_1e8._0_8_;
            pdVar21 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            do {
              pdVar21[(long)pMVar13] =
                   (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                              local_1e8._8_8_)->m_storage).m_data)[(long)pMVar13] * local_1b8 +
                   *(double *)(lVar16 + (long)pMVar13 * 8);
              pMVar13 = pMVar13 + 1;
            } while (pMVar14 != pMVar13);
          }
          bVar25 = SBORROW8(lVar18,(long)this->n_aug_ * 2);
          lVar16 = lVar18 + (long)this->n_aug_ * -2;
          lVar18 = lVar18 + 1;
        } while (bVar25 != lVar16 < 0);
      }
      local_1e8._0_8_ =
           (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_1e8._8_8_ =
           (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      local_1e8._16_8_ = (Matrix<double,_1,1,0,_1,1> *)0x0;
      if (-1 < (long)(local_1e8._8_8_ | local_1e8._0_8_)) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_140,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)local_1e8);
        if (-1 < this->n_aug_) {
          lVar18 = 0;
          do {
            pMVar12 = (MatrixXd *)
                      (this->Xsig_pred_).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_rows;
            pMVar14 = (Matrix<double,_1,1,0,_1,1> *)
                      ((this->Xsig_pred_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_data + (long)pMVar12 * lVar18);
            if ((long)pMVar12 < 0 && pMVar14 != (Matrix<double,_1,1,0,_1,1> *)0x0)
            goto LAB_001055cc;
            if ((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols <= lVar18) goto LAB_001055eb;
            local_1e8._0_8_ = pMVar14;
            local_1e8._8_8_ = pMVar12;
            local_1d0 = &this->Xsig_pred_;
            pMStack_1c8 = pMVar12;
            local_1c0 = (Matrix<double,_1,1,0,_1,1> *)this_00;
            if (pMVar12 !=
                (MatrixXd *)
                (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
              pcVar15 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
              ;
              goto LAB_001056d3;
            }
            Eigen::Matrix<double,-1,1,0,-1,1>::
            Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                      ((Matrix<double,_1,1,0,_1,1> *)&local_d8,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_1e8);
            if (local_d0 < 4) goto LAB_0010560a;
            dVar6 = *(double *)((long)local_d8 + 0x18);
            if (3.141592653589793 < dVar6) {
              do {
                dVar6 = dVar6 + -6.283185307179586;
              } while (3.141592653589793 < dVar6);
              *(double *)((long)local_d8 + 0x18) = dVar6;
            }
            if (dVar6 < -3.141592653589793) {
              do {
                dVar6 = dVar6 + 6.283185307179586;
              } while (dVar6 < -3.141592653589793);
              *(double *)((long)local_d8 + 0x18) = dVar6;
            }
            if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows <= lVar18) goto LAB_0010560a;
            local_1e8._8_8_ =
                 (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[lVar18];
            local_1d0 = (MatrixXd *)0x0;
            pMStack_1c8 = (MatrixXd *)0x0;
            local_1c0 = (Matrix<double,_1,1,0,_1,1> *)0x0;
            local_80 = local_140;
            local_1e8._0_8_ = (Matrix<double,_1,1,0,_1,1> *)&local_d8;
            local_1e8._16_8_ = (Matrix<double,_1,1,0,_1,1> *)&local_d8;
            local_78 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_1e8);
            if (((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows != *(long *)(local_1e8._0_8_ + 8)) ||
               ((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols != *(long *)(local_1e8._16_8_ + 8))) {
              pcVar15 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>]"
              ;
              goto LAB_001056d3;
            }
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_140,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                        *)&local_80);
            free(local_1d0);
            free(local_d8);
            bVar25 = SBORROW8(lVar18,(long)this->n_aug_ * 2);
            lVar16 = lVar18 + (long)this->n_aug_ * -2;
            lVar18 = lVar18 + 1;
          } while (bVar25 != lVar16 < 0);
        }
        free(local_118);
        free(local_1a8.m_data);
        free(local_188.m_data);
        free(local_1f8.m_data);
        free(local_100);
        free(local_168.m_data);
        return;
      }
    }
    pcVar15 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
LAB_001057ea:
    local_1e8._16_8_ = 0;
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,pcVar15);
  }
LAB_0010571b:
  pcVar15 = 
  "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
  ;
  goto LAB_001056b4;
LAB_00105671:
  pcVar15 = 
  "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
  ;
  goto LAB_001056b4;
LAB_0010565a:
  pcVar15 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
  ;
  goto LAB_001056d3;
LAB_00105629:
  pcVar15 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
  ;
LAB_001056d3:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x84,pcVar15);
LAB_00105643:
  pcVar15 = 
  "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
  ;
LAB_001056b4:
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Assign.h"
                ,0x1f9,pcVar15);
}

Assistant:

void UKF::Prediction(double delta_t) {
  /**
  TODO:

  Complete this function! Estimate the object's location. Modify the state
  vector, x_. Predict sigma points, the state, and the state covariance matrix.
  */

  /*****************************************************************************
  *  Generate Sigma Points
  ****************************************************************************/
  //create sigma point matrix
  MatrixXd Xsig = MatrixXd(n_x_, 2 * n_x_ + 1);

  //calculate square root of P
  MatrixXd A = P_.llt().matrixL();

  //set lambda for non-augmented sigma points
  lambda_ = 3 - n_x_;

  //set first column of sigma point matrix
  Xsig.col(0) = x_;

  //set remaining sigma points
  for (int i = 0; i < n_x_; i++)
  {
    Xsig.col(i + 1) = x_ + sqrt(lambda_ + n_x_) * A.col(i);
    Xsig.col(i + 1 + n_x_) = x_ - sqrt(lambda_ + n_x_) * A.col(i);
  }

  /*****************************************************************************
  *  Augment Sigma Points
  ****************************************************************************/
  //create augmented mean vector
  VectorXd x_aug = VectorXd(n_aug_);

  //create augmented state covariance
  MatrixXd P_aug = MatrixXd(n_aug_, n_aug_);

  //create sigma point matrix
  MatrixXd Xsig_aug = MatrixXd(n_aug_, 2 * n_aug_ + 1);

  //set lambda for augmented sigma points
  lambda_ = 3 - n_aug_;

  //create augmented mean state
  x_aug.head(5) = x_;
  x_aug(5) = 0;
  x_aug(6) = 0;

  //create augmented covariance matrix
  P_aug.fill(0.0);
  P_aug.topLeftCorner(5, 5) = P_;
  P_aug(5, 5) = std_a_*std_a_;
  P_aug(6, 6) = std_yawdd_*std_yawdd_;

  //create square root matrix
  MatrixXd L = P_aug.llt().matrixL();

  //create augmented sigma points
  Xsig_aug.col(0) = x_aug;
  for (int i = 0; i< n_aug_; i++)
  {
    Xsig_aug.col(i + 1) = x_aug + sqrt(lambda_ + n_aug_) * L.col(i);
    Xsig_aug.col(i + 1 + n_aug_) = x_aug - sqrt(lambda_ + n_aug_) * L.col(i);
  }

  /*****************************************************************************
  *  Predict Sigma Points
  ****************************************************************************/
  //predict sigma points
  for (int i = 0; i < 2 * n_aug_ + 1; i++)
  {
    //extract values for better readability
    double p_x      = Xsig_aug(0, i);
    double p_y      = Xsig_aug(1, i);
    double v        = Xsig_aug(2, i);
    double yaw      = Xsig_aug(3, i);
    double yawd     = Xsig_aug(4, i);
    double nu_a     = Xsig_aug(5, i);
    double nu_yawdd = Xsig_aug(6, i);

    //predicted state values
    double px_p, py_p;

    //avoid division by zero
    if (fabs(yawd) > 0.001) {
      px_p = p_x + v / yawd * (sin(yaw + yawd * delta_t) - sin(yaw));
      py_p = p_y + v / yawd * (cos(yaw) - cos(yaw + yawd * delta_t));
    }
    else {
      px_p = p_x + v * delta_t * cos(yaw);
      py_p = p_y + v * delta_t * sin(yaw);
    }

    double v_p = v;
    double yaw_p = yaw + yawd * delta_t;
    double yawd_p = yawd;

    //add noise
    px_p = px_p + 0.5 * nu_a * delta_t * delta_t * cos(yaw);
    py_p = py_p + 0.5 * nu_a * delta_t * delta_t * sin(yaw);
    v_p = v_p + nu_a*delta_t;

    yaw_p = yaw_p + 0.5*nu_yawdd*delta_t*delta_t;
    yawd_p = yawd_p + nu_yawdd*delta_t;

    //write predicted sigma point into right column
    Xsig_pred_(0, i) = px_p;
    Xsig_pred_(1, i) = py_p;
    Xsig_pred_(2, i) = v_p;
    Xsig_pred_(3, i) = yaw_p;
    Xsig_pred_(4, i) = yawd_p;
  }

  /*****************************************************************************
  *  Convert Predicted Sigma Points to Mean/Covariance
  ****************************************************************************/

  // set weights
  double weight_0 = lambda_ / (lambda_ + n_aug_);
  weights_(0) = weight_0;
  for (int i = 1; i < 2 * n_aug_ + 1; i++) {  //2n+1 weights
    double weight = 0.5 / (n_aug_ + lambda_);
    weights_(i) = weight;
  }

  //predicted state mean
  x_.fill(0.0);             //******* necessary? *********
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //iterate over sigma points
    x_ = x_ + weights_(i) * Xsig_pred_.col(i);
  }

  //predicted state covariance matrix
  P_.fill(0.0);             //******* necessary? *********
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //iterate over sigma points

    // state difference
    VectorXd x_diff = Xsig_pred_.col(i) - x_;
    //angle normalization
    while (x_diff(3)> M_PI) x_diff(3) -= 2.*M_PI;
    while (x_diff(3)<-M_PI) x_diff(3) += 2.*M_PI;

    P_ = P_ + weights_(i) * x_diff * x_diff.transpose();
  }

}